

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Algorithm.h
# Opt level: O1

void idx2::InsertionSort<idx2::t2<unsigned_int,idx2::channel*>*>
               (t2<unsigned_int,_idx2::channel_*> *Beg,t2<unsigned_int,_idx2::channel_*> *End)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  channel *pcVar4;
  channel *pcVar5;
  t2<unsigned_int,_idx2::channel_*> *ptVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  t2<unsigned_int,_idx2::channel_*> *ptVar9;
  undefined8 in_RCX;
  t2<unsigned_int,_idx2::channel_*> *ptVar10;
  t2<unsigned_int,_idx2::channel_*> *ptVar11;
  t2<unsigned_int,_idx2::channel_*> *ptVar12;
  t2<unsigned_int,_idx2::channel_*> *ptVar13;
  
  ptVar10 = (t2<unsigned_int,_idx2::channel_*> *)CONCAT71((int7)((ulong)in_RCX >> 8),Beg == End);
  ptVar9 = Beg + 1;
  if (ptVar9 != End && Beg != End) {
    do {
      uVar1 = ptVar9->First;
      ptVar11 = ptVar9;
      ptVar13 = Beg;
      do {
        ptVar6 = ptVar9;
        ptVar12 = ptVar11;
        if (ptVar11 <= ptVar13) break;
        ptVar12 = (t2<unsigned_int,_idx2::channel_*> *)
                  (&ptVar13->First +
                  (((long)ptVar11 - (long)ptVar13 >> 4) - ((long)ptVar11 - (long)ptVar13 >> 0x3f) &
                  0xfffffffffffffffeU) * 2);
        uVar2 = ptVar12->First;
        if (uVar2 < uVar1) {
          ptVar13 = ptVar12 + 1;
          bVar3 = true;
          ptVar12 = ptVar11;
        }
        else {
          bVar3 = uVar1 < uVar2;
          if (uVar2 <= uVar1) {
            ptVar10 = ptVar12;
            ptVar12 = ptVar11;
          }
        }
        ptVar11 = ptVar12;
        ptVar12 = ptVar10;
      } while (bVar3);
      for (; ptVar10 = ptVar12, ptVar6 != ptVar10; ptVar6 = ptVar6 + -1) {
        uVar1 = ptVar6->First;
        uVar8 = *(undefined4 *)&ptVar6->field_0x4;
        pcVar4 = ptVar6->Second;
        uVar7 = *(undefined4 *)&ptVar6[-1].field_0x4;
        pcVar5 = ptVar6[-1].Second;
        ptVar6->First = ptVar6[-1].First;
        *(undefined4 *)&ptVar6->field_0x4 = uVar7;
        ptVar6->Second = pcVar5;
        ptVar6[-1].First = uVar1;
        *(undefined4 *)&ptVar6[-1].field_0x4 = uVar8;
        ptVar6[-1].Second = pcVar4;
        ptVar12 = ptVar10;
      }
      ptVar9 = ptVar9 + 1;
    } while (ptVar9 != End);
  }
  return;
}

Assistant:

void
InsertionSort(i Beg, i End)
{
  if (Beg == End)
    return;
  i Last = Beg + 1;
  while (Last != End)
  {
    i Pos = BinarySearch(Beg, Last, *Last);
    for (i It = Last; It != Pos; --It)
      Swap(It, It - 1);
    ++Last;
  }
}